

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendReceiver.cpp
# Opt level: O0

string * __thiscall
SendReceiver::sendInfoRequest(string *__return_storage_ptr__,SendReceiver *this,string *id)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  CURLcode res;
  CURL *curl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string link;
  string *id_local;
  SendReceiver *this_local;
  string *data;
  
  link.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator+(&local_68,"https://anonfile.com/api/v2/file/",id);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,"/info");
  std::__cxx11::string::~string((string *)&local_68);
  lVar2 = curl_easy_init();
  if (lVar2 != 0) {
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
    curl_easy_setopt(lVar2,0x2712,pcVar3);
    curl_easy_setopt(lVar2,0x34,1);
    curl_easy_setopt(lVar2,0x4e2b,writeCallback);
    curl_easy_setopt(lVar2,0x2711,__return_storage_ptr__);
    iVar1 = curl_easy_perform(lVar2);
    if (iVar1 != 0) {
      std::operator<<((ostream *)&std::cout,"Error, check your internet connection!\n");
    }
  }
  curl_easy_cleanup(lVar2);
  link.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_48);
  if ((link.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SendReceiver::sendInfoRequest(const std::string& id) {
  std::string data;
  std::string link = Anonfiles::Fileinfo + id + "/info";
  CURL* curl = curl_easy_init();
  CURLcode res;

  if (curl) {
    curl_easy_setopt(curl, CURLOPT_URL, link.c_str());

#ifndef LINUX
    curl_easy_setopt(curl, CURLOPT_SSLCERTTYPE, "PEM");
    curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1L);
    curl_easy_setopt(curl, CURLOPT_CAINFO, NULL);
    curl_easy_setopt(curl, CURLOPT_CAPATH, NULL);
    curl_easy_setopt(curl, CURLOPT_FRESH_CONNECT, 1L);
    curl_easy_setopt(curl, CURLOPT_SSL_CTX_FUNCTION, *sslctx_function); // set void* and load cacert.pem from memory
#endif

    curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &writeCallback);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &data);

    res = curl_easy_perform(curl);
    if (res != CURLE_OK)
      std::cout << "Error, check your internet connection!\n";
  }

  curl_easy_cleanup(curl);

  return data;
}